

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basictests.cpp
# Opt level: O3

void test32<1000000001u>(void)

{
  ostream *poVar1;
  ulong uVar2;
  uint uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(32-bit) testing ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  uVar3 = 1;
  do {
    uVar2 = (ulong)uVar3 * 0x89705f3f & 0x1fffffffffffffff;
    if ((uVar3 % 0x3b9aca01 == 0) != uVar2 < 0x89705f3f) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"problem with n = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"quotient: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3 / 0x3b9aca01);
      poVar1 = std::operator<<(poVar1," expected: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3 / 0x3b9aca01);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"remainder: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3 % 0x3b9aca01);
      poVar1 = std::operator<<(poVar1," expected: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3 % 0x3b9aca01);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"multiple: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2 < 0x89705f3f);
      poVar1 = std::operator<<(poVar1," expected: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3 % 0x3b9aca01 == 0);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"need_fallback = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,false);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"is_power_2    = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,false);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"c             = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x89705f3f);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"leading_zeroes= ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"log2_divisor  = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1d);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"m             = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x2000000000000000);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"overflow      = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,true);
      std::endl<char,std::char_traits<char>>(poVar1);
      abort();
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0);
  return;
}

Assistant:

void test32() {
  std::cout << "(32-bit) testing " << divisor << std::endl;
  for (uint32_t n = 1; n != 0; n++) {
    bool quotient_ok =
        fast_division::divide32<divisor>::quotient(n) == n / divisor;
    bool remainder_ok =
        fast_division::divide32<divisor>::remainder(n) == n % divisor;
    bool mult_ok =
        fast_division::divide32<divisor>::is_divisible(n) == (n % divisor == 0);
    if (!quotient_ok || !remainder_ok || !mult_ok) {
      std::cerr << "problem with n = " << n << std::endl;
      std::cout << "quotient: " << fast_division::divide32<divisor>::quotient(n)
                << " expected: " << n / divisor << std::endl;
      std::cout << "remainder: "
                << fast_division::divide32<divisor>::remainder(n)
                << " expected: " << n % divisor << std::endl;
      std::cout << "multiple: "
                << fast_division::divide32<divisor>::is_divisible(n)
                << " expected: " << (n % divisor == 0) << std::endl;

      std::cout << "need_fallback = "
                << fast_division::divide32<divisor>::need_fallback << std::endl;
      std::cout << "is_power_2    = "
                << fast_division::divide32<divisor>::is_power_2 << std::endl;
      std::cout << "c             = " << fast_division::divide32<divisor>::c
                << std::endl;
      std::cout << "leading_zeroes= "
                << fast_division::divide32<divisor>::leading_zeroes
                << std::endl;
      std::cout << "log2_divisor  = "
                << fast_division::divide32<divisor>::log2_divisor << std::endl;
      std::cout << "m             = " << fast_division::divide32<divisor>::m
                << std::endl;
      std::cout << "overflow      = "
                << fast_division::divide32<divisor>::overflow << std::endl;

      abort();
    }
  }
}